

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

matrix<double> * __thiscall mat_lib::matrix<double>::operator/=(matrix<double> *this,float scalar)

{
  element_t *peVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  size_t sVar3;
  ulong local_1d8;
  size_t j;
  size_t i;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream str_stream;
  float scalar_local;
  matrix<double> *this_local;
  
  if ((scalar == 0.0) && (!NAN(scalar))) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,"divide by zero! bad scalar provided (");
    poVar2 = std::operator<<(poVar2,"operator/=");
    poVar2 = std::operator<<(poVar2,"() in ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x183);
    std::operator<<(poVar2,")");
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this_00,local_1c0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  for (j = 0; j < this->rows__; j = j + 1) {
    for (local_1d8 = 0; local_1d8 < this->columns__; local_1d8 = local_1d8 + 1) {
      peVar1 = this->elements__;
      sVar3 = offset__(this,j,(int)local_1d8);
      peVar1[sVar3] = peVar1[sVar3] / (double)scalar;
    }
  }
  return this;
}

Assistant:

matrix<T>& matrix<T>::operator/=(float scalar)
  {
    if(scalar==0) 
    {
      ostringstream str_stream;
      str_stream<<"divide by zero! bad scalar provided ("
        <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
      throw invalid_argument(str_stream.str());
    }
    for(size_t i=0; i<rows__; i++)
      for(size_t j=0; j<columns__; j++) elements__[offset__(i,j)]/=scalar;

    return *this;
  }